

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGenerator.cpp
# Opt level: O2

Deck * __thiscall
solitaire::cards::ShuffledDeckGenerator::generate
          (Deck *__return_storage_ptr__,ShuffledDeckGenerator *this)

{
  ulong uVar1;
  int iVar2;
  default_random_engine dre;
  random_device rd;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a0;
  random_device local_1398;
  
  generateSortedDeck(__return_storage_ptr__,this);
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  iVar2 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  local_13a0._M_x = (unsigned_long)(iVar2 + (uint)(iVar2 == 0));
  std::
  shuffle<solitaire::cards::Card*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            (__return_storage_ptr__->_M_elems,__return_storage_ptr__[1]._M_elems,&local_13a0);
  std::random_device::~random_device(&local_1398);
  return __return_storage_ptr__;
}

Assistant:

Deck ShuffledDeckGenerator::generate() const {
    auto generatedDeck = generateSortedDeck();
    auto rd = std::random_device {};
    auto dre = std::default_random_engine {rd()};
    std::shuffle(std::begin(generatedDeck), std::end(generatedDeck), dre);
    return generatedDeck;
}